

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool __thiscall ON_BoundingBox::GetCorners(ON_BoundingBox *this,ON_3dPoint *corners)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint *pOVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ON_BoundingBox *pOVar10;
  long lVar11;
  
  bVar5 = IsNotEmpty(this);
  uVar6 = 0;
  if (bVar5) {
    lVar8 = 0;
    do {
      pOVar10 = (ON_BoundingBox *)&this->m_max;
      if (uVar6 == 0) {
        pOVar10 = this;
      }
      dVar1 = (pOVar10->m_min).x;
      iVar9 = 0;
      do {
        pOVar4 = &this->m_max;
        if (iVar9 == 0) {
          pOVar4 = &this->m_min;
        }
        dVar2 = pOVar4->y;
        lVar7 = (long)(int)lVar8;
        lVar8 = lVar7 + 2;
        lVar11 = 0;
        do {
          pOVar4 = &this->m_max;
          if ((int)lVar11 == 0) {
            pOVar4 = &this->m_min;
          }
          dVar3 = pOVar4->z;
          *(double *)((long)&corners[lVar7].x + lVar11) = dVar1;
          *(double *)((long)&corners[lVar7].y + lVar11) = dVar2;
          *(double *)((long)&corners[lVar7].z + lVar11) = dVar3;
          lVar11 = lVar11 + 0x18;
        } while ((int)lVar11 == 0x18);
        bVar5 = iVar9 == 0;
        iVar9 = iVar9 + 1;
      } while (bVar5);
      bVar5 = uVar6 == 0;
      uVar6 = uVar6 + 1;
    } while (bVar5);
    uVar6 = (uint)(lVar8 == 8);
  }
  return SUB41(uVar6,0);
}

Assistant:

bool
ON_BoundingBox::GetCorners( 
  ON_3dPoint corners[8]// returns list of 8 corner points
  ) const
{
  int n = 0;
  if ( IsValid() ) 
  {
    ON_3dPoint P;
    int i,j,k;
    for( i = 0; i < 2; i++ ) 
    {
      P.x = (i) ? m_max.x : m_min.x;
      for ( j = 0; j < 2; j++ )
      {
        P.y = (j) ? m_max.y : m_min.y;
        for ( k = 0; k < 2; k++ )
        {
          P.z = (k) ? m_max.z : m_min.z;
          corners[n++] = P;
        }
      }
    }
  }
  return (8==n);
}